

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialNonce::ConfidentialNonce(ConfidentialNonce *this,Pubkey *pubkey)

{
  ByteData local_30;
  Pubkey *local_18;
  Pubkey *pubkey_local;
  ConfidentialNonce *this_local;
  
  local_18 = pubkey;
  pubkey_local = (Pubkey *)this;
  Pubkey::GetData(&local_30,pubkey);
  ConfidentialNonce(this,&local_30);
  ByteData::~ByteData(&local_30);
  return;
}

Assistant:

ConfidentialNonce::ConfidentialNonce(const Pubkey &pubkey)
    : ConfidentialNonce(pubkey.GetData()) {
  // do nothing
}